

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>_>
::~ExceptionOr(ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>_>
               *this)

{
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>_>
  *this_local;
  
  Maybe<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>_>::~Maybe
            (&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;